

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_types.cpp
# Opt level: O3

void jaegertracing::thrift::swap(DependencyLink *a,DependencyLink *b)

{
  int64_t iVar1;
  
  std::__cxx11::string::swap((string *)&a->parent);
  std::__cxx11::string::swap((string *)&a->child);
  iVar1 = a->callCount;
  a->callCount = b->callCount;
  b->callCount = iVar1;
  return;
}

Assistant:

void swap(DependencyLink &a, DependencyLink &b) {
  using ::std::swap;
  swap(a.parent, b.parent);
  swap(a.child, b.child);
  swap(a.callCount, b.callCount);
}